

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

void __thiscall
cmCTestTestHandler::RecordCustomTestMeasurements
          (cmCTestTestHandler *this,cmXMLWriter *xml,string *content)

{
  char *pcVar1;
  cmCTest *this_00;
  cmCTestTestHandler *pcVar2;
  bool bVar3;
  int iVar4;
  unsigned_long length;
  uchar *puVar5;
  size_t sVar6;
  long *plVar7;
  ostream *poVar8;
  size_type *psVar9;
  pointer pcVar10;
  ulong uVar11;
  string measurement_str;
  cmCTestTestMeasurementXMLParser parser;
  ostringstream ostr;
  ifstream ifs;
  string local_500;
  uchar *local_4e0;
  cmCTestTestHandler *local_4d8;
  string local_4d0;
  char *local_4b0;
  undefined8 local_4a8;
  char local_4a0;
  undefined7 uStack_49f;
  _func_int **local_490;
  string *local_488;
  cmXMLParser local_480;
  string local_458;
  undefined1 *local_438;
  undefined8 local_430;
  undefined1 local_428;
  undefined7 uStack_427;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  RegularExpression *local_3d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  undefined1 local_3b0 [112];
  ios_base local_340 [264];
  undefined1 local_238 [112];
  ios_base local_1c8 [408];
  
  local_3d8 = &this->SingleTestMeasurementRegex;
  local_4d8 = this;
  local_488 = content;
  bVar3 = cmsys::RegularExpression::find(local_3d8,(content->_M_dataplus)._M_p,&local_3d8->regmatch)
  ;
  if (bVar3) {
    local_490 = (_func_int **)&PTR__cmCTestTestMeasurementXMLParser_009496b8;
    do {
      pcVar10 = local_238 + 0x10;
      pcVar1 = (local_4d8->SingleTestMeasurementRegex).regmatch.startp[1];
      if (pcVar1 == (char *)0x0) {
        local_4b0 = &local_4a0;
        local_4a8 = 0;
        local_4a0 = '\0';
      }
      else {
        local_4b0 = &local_4a0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_4b0,pcVar1,
                   (local_4d8->SingleTestMeasurementRegex).regmatch.endp[1]);
      }
      cmXMLParser::cmXMLParser(&local_480);
      local_480._vptr_cmXMLParser = local_490;
      local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
      local_458._M_string_length = 0;
      local_458.field_2._M_local_buf[0] = '\0';
      local_438 = &local_428;
      local_430 = 0;
      local_428 = 0;
      local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
      local_418._M_string_length = 0;
      local_418.field_2._M_local_buf[0] = '\0';
      local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
      local_3f8._M_string_length = 0;
      local_3f8.field_2._M_local_buf[0] = '\0';
      cmXMLParser::Parse(&local_480,local_4b0);
      iVar4 = std::__cxx11::string::compare((char *)&local_438);
      if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_438), iVar4 == 0)) {
        local_238._0_8_ = pcVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"NamedMeasurement","");
        cmXMLWriter::StartElement(xml,(string *)local_238);
        if ((pointer)local_238._0_8_ != pcVar10) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,"type",&local_3f8);
        cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",&local_418);
        local_238._0_8_ = pcVar10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Value","");
        cmXMLWriter::StartElement(xml,(string *)local_238);
        cmXMLWriter::Content<std::__cxx11::string>(xml,&local_458);
        cmXMLWriter::EndElement(xml);
        if ((pointer)local_238._0_8_ != pcVar10) {
          operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
        }
        cmXMLWriter::EndElement(xml);
      }
      else {
        iVar4 = std::__cxx11::string::compare((char *)&local_438);
        if ((iVar4 == 0) || (iVar4 = std::__cxx11::string::compare((char *)&local_438), iVar4 == 0))
        {
          cmCTest::CleanString(&local_4d0,&local_458,0);
          bVar3 = cmsys::SystemTools::FileExists(&local_4d0);
          if (bVar3) {
            length = cmsys::SystemTools::FileLength(&local_4d0);
            if (length == 0) {
              local_238._0_8_ = pcVar10;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_238,"NamedMeasurement","");
              cmXMLWriter::StartElement(xml,(string *)local_238);
              if ((pointer)local_238._0_8_ != pcVar10) {
                operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
              }
              cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",&local_418);
              cmXMLWriter::Attribute<char[12]>(xml,"type",(char (*) [12])"text/string");
              cmXMLWriter::Attribute<char[5]>(xml,"encoding",(char (*) [5])0x746a21);
              local_238._0_8_ = pcVar10;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Value","");
              std::operator+(&local_500,"Image ",&local_4d0);
              plVar7 = (long *)std::__cxx11::string::append((char *)&local_500);
              local_3b0._0_8_ = local_3b0 + 0x10;
              psVar9 = (size_type *)(plVar7 + 2);
              if ((size_type *)*plVar7 == psVar9) {
                local_3b0._16_8_ = *psVar9;
                local_3b0._24_8_ = plVar7[3];
              }
              else {
                local_3b0._16_8_ = *psVar9;
                local_3b0._0_8_ = (size_type *)*plVar7;
              }
              local_3b0._8_8_ = plVar7[1];
              *plVar7 = (long)psVar9;
              plVar7[1] = 0;
              *(undefined1 *)(plVar7 + 2) = 0;
              cmXMLWriter::StartElement(xml,(string *)local_238);
              cmXMLWriter::Content<std::__cxx11::string>
                        (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_3b0);
              cmXMLWriter::EndElement(xml);
              if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
                operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_500._M_dataplus._M_p != &local_500.field_2) {
                operator_delete(local_500._M_dataplus._M_p,
                                local_500.field_2._M_allocated_capacity + 1);
              }
              if ((pointer)local_238._0_8_ != pcVar10) {
                operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
              }
              cmXMLWriter::EndElement(xml);
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)&local_3f8);
              if (iVar4 == 0) {
                AttachFile(local_4d8,xml,&local_4d0,&local_418);
              }
              else {
                std::ifstream::ifstream(local_238,local_4d0._M_dataplus._M_p,_S_in);
                puVar5 = (uchar *)operator_new__(length + 1);
                memset(puVar5,0,length + 1);
                local_4e0 = puVar5;
                std::istream::read(local_238,(long)puVar5);
                uVar11 = (ulong)(int)((double)(long)length * 1.5 + 5.0);
                puVar5 = (uchar *)operator_new__(uVar11);
                memset(puVar5,0,uVar11);
                sVar6 = cmsysBase64_Encode(local_4e0,length,puVar5,1);
                local_3b0._0_8_ = local_3b0 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_3b0,"NamedMeasurement","");
                cmXMLWriter::StartElement(xml,(string *)local_3b0);
                if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
                  operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
                }
                cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",&local_418);
                cmXMLWriter::Attribute<std::__cxx11::string>(xml,"type",&local_3f8);
                cmXMLWriter::Attribute<char[7]>(xml,"encoding",(char (*) [7])"base64");
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
                if (sVar6 != 0) {
                  uVar11 = 0;
                  do {
                    local_500._M_dataplus._M_p._0_1_ = puVar5[uVar11];
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_3b0,(char *)&local_500,1);
                    if ((uVar11 != 0) && ((uVar11 / 0x3c) * 0x3c - uVar11 == 0)) {
                      std::ios::widen((char)*(undefined8 *)(local_3b0._0_8_ + -0x18) +
                                      (char)local_3b0);
                      std::ostream::put((char)local_3b0);
                      std::ostream::flush();
                    }
                    uVar11 = uVar11 + 1;
                  } while (sVar6 != uVar11);
                }
                local_500._M_dataplus._M_p = (pointer)&local_500.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_500,"Value","");
                std::__cxx11::stringbuf::str();
                cmXMLWriter::StartElement(xml,&local_500);
                cmXMLWriter::Content<std::__cxx11::string>(xml,&local_3d0);
                cmXMLWriter::EndElement(xml);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
                  operator_delete(local_3d0._M_dataplus._M_p,
                                  local_3d0.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_500._M_dataplus._M_p != &local_500.field_2) {
                  operator_delete(local_500._M_dataplus._M_p,
                                  local_500.field_2._M_allocated_capacity + 1);
                }
                cmXMLWriter::EndElement(xml);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
                std::ios_base::~ios_base(local_340);
                operator_delete__(puVar5);
                operator_delete__(local_4e0);
                std::ifstream::~ifstream(local_238);
              }
            }
          }
          else {
            local_238._0_8_ = pcVar10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"NamedMeasurement","");
            cmXMLWriter::StartElement(xml,(string *)local_238);
            if ((pointer)local_238._0_8_ != pcVar10) {
              operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
            }
            cmXMLWriter::Attribute<std::__cxx11::string>(xml,"name",&local_418);
            cmXMLWriter::Attribute<char[12]>(xml,"text",(char (*) [12])"text/string");
            local_238._0_8_ = pcVar10;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Value","");
            std::operator+(&local_500,"File ",&local_4d0);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_500);
            local_3b0._0_8_ = local_3b0 + 0x10;
            psVar9 = (size_type *)(plVar7 + 2);
            if ((size_type *)*plVar7 == psVar9) {
              local_3b0._16_8_ = *psVar9;
              local_3b0._24_8_ = plVar7[3];
            }
            else {
              local_3b0._16_8_ = *psVar9;
              local_3b0._0_8_ = (size_type *)*plVar7;
            }
            local_3b0._8_8_ = plVar7[1];
            *plVar7 = (long)psVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            cmXMLWriter::StartElement(xml,(string *)local_238);
            cmXMLWriter::Content<std::__cxx11::string>
                      (xml,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_3b0);
            cmXMLWriter::EndElement(xml);
            if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
              operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_500._M_dataplus._M_p != &local_500.field_2) {
              operator_delete(local_500._M_dataplus._M_p,local_500.field_2._M_allocated_capacity + 1
                             );
            }
            if ((pointer)local_238._0_8_ != pcVar10) {
              operator_delete((void *)local_238._0_8_,local_238._16_8_ + 1);
            }
            cmXMLWriter::EndElement(xml);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"File \"",6);
            poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_238,local_4d0._M_dataplus._M_p,
                                local_4d0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\" not found.",0xc);
            std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            pcVar2 = local_4d8;
            this_00 = (local_4d8->super_cmCTestGenericHandler).CTest;
            std::__cxx11::stringbuf::str();
            cmCTest::Log(this_00,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                         ,0x7ec,(char *)local_3b0._0_8_,(pcVar2->super_cmCTestGenericHandler).Quiet)
            ;
            if ((undefined1 *)local_3b0._0_8_ != local_3b0 + 0x10) {
              operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
            std::ios_base::~ios_base(local_1c8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
            operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
          }
        }
      }
      cmsys::SystemTools::ReplaceString(local_488,local_4b0,"");
      local_480._vptr_cmXMLParser = local_490;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p,
                        CONCAT71(local_3f8.field_2._M_allocated_capacity._1_7_,
                                 local_3f8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_dataplus._M_p != &local_418.field_2) {
        operator_delete(local_418._M_dataplus._M_p,
                        CONCAT71(local_418.field_2._M_allocated_capacity._1_7_,
                                 local_418.field_2._M_local_buf[0]) + 1);
      }
      if (local_438 != &local_428) {
        operator_delete(local_438,CONCAT71(uStack_427,local_428) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,
                        CONCAT71(local_458.field_2._M_allocated_capacity._1_7_,
                                 local_458.field_2._M_local_buf[0]) + 1);
      }
      cmXMLParser::~cmXMLParser(&local_480);
      if (local_4b0 != &local_4a0) {
        operator_delete(local_4b0,CONCAT71(uStack_49f,local_4a0) + 1);
      }
      bVar3 = cmsys::RegularExpression::find
                        (local_3d8,(local_488->_M_dataplus)._M_p,&local_3d8->regmatch);
    } while (bVar3);
  }
  return;
}

Assistant:

void cmCTestTestHandler::RecordCustomTestMeasurements(cmXMLWriter& xml,
                                                      std::string content)
{
  while (this->SingleTestMeasurementRegex.find(content)) {
    // Extract regex match from content and parse it as an XML element.
    auto measurement_str = this->SingleTestMeasurementRegex.match(1);
    auto parser = cmCTestTestMeasurementXMLParser();
    parser.Parse(measurement_str.c_str());

    if (parser.ElementName == "CTestMeasurement" ||
        parser.ElementName == "DartMeasurement") {
      xml.StartElement("NamedMeasurement");
      xml.Attribute("type", parser.MeasurementType);
      xml.Attribute("name", parser.MeasurementName);
      xml.Element("Value", parser.CharacterData);
      xml.EndElement();
    } else if (parser.ElementName == "CTestMeasurementFile" ||
               parser.ElementName == "DartMeasurementFile") {
      const std::string& filename = cmCTest::CleanString(parser.CharacterData);
      if (!cmSystemTools::FileExists(filename)) {
        xml.StartElement("NamedMeasurement");
        xml.Attribute("name", parser.MeasurementName);
        xml.Attribute("text", "text/string");
        xml.Element("Value", "File " + filename + " not found");
        xml.EndElement();
        cmCTestOptionalLog(
          this->CTest, HANDLER_OUTPUT,
          "File \"" << filename << "\" not found." << std::endl, this->Quiet);
      } else {
        long len = cmSystemTools::FileLength(filename);
        if (len == 0) {
          xml.StartElement("NamedMeasurement");
          xml.Attribute("name", parser.MeasurementName);
          xml.Attribute("type", "text/string");
          xml.Attribute("encoding", "none");
          xml.Element("Value", "Image " + filename + " is empty");
          xml.EndElement();
        } else {
          if (parser.MeasurementType == "file") {
            // Treat this measurement like an "ATTACHED_FILE" when the type
            // is explicitly "file" (not an image).
            this->AttachFile(xml, filename, parser.MeasurementName);
          } else {
            cmsys::ifstream ifs(filename.c_str(),
                                std::ios::in
#ifdef _WIN32
                                  | std::ios::binary
#endif
            );
            auto file_buffer = cm::make_unique<unsigned char[]>(len + 1);
            ifs.read(reinterpret_cast<char*>(file_buffer.get()), len);
            auto encoded_buffer = cm::make_unique<unsigned char[]>(
              static_cast<int>(static_cast<double>(len) * 1.5 + 5.0));

            size_t rlen = cmsysBase64_Encode(file_buffer.get(), len,
                                             encoded_buffer.get(), 1);

            xml.StartElement("NamedMeasurement");
            xml.Attribute("name", parser.MeasurementName);
            xml.Attribute("type", parser.MeasurementType);
            xml.Attribute("encoding", "base64");
            std::ostringstream ostr;
            for (size_t cc = 0; cc < rlen; cc++) {
              ostr << encoded_buffer[cc];
              if (cc % 60 == 0 && cc) {
                ostr << std::endl;
              }
            }
            xml.Element("Value", ostr.str());
            xml.EndElement(); // NamedMeasurement
          }
        }
      }
    }

    // Remove this element from content.
    cmSystemTools::ReplaceString(content, measurement_str.c_str(), "");
  }
}